

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<64U,_unsigned_short,_void,_true> __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_true>::operator-
          (uintwide_t<64U,_unsigned_short,_void,_true> *this)

{
  ushort *puVar1;
  short *psVar2;
  long lVar3;
  bool bVar4;
  uintwide_t<64U,_unsigned_short,_void,_true> tmp;
  
  tmp.values.super_array<unsigned_short,_4UL>.elems =
       (representation_type)
       ((array<unsigned_short,_4UL>)
       *(array<unsigned_short,_4UL> *)(this->values).super_array<unsigned_short,_4UL>.elems).
       super_array<unsigned_short,_4UL>;
  lVar3 = 0;
  do {
    puVar1 = (ushort *)((long)tmp.values.super_array<unsigned_short,_4UL>.elems + lVar3);
    *puVar1 = ~*puVar1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    psVar2 = (short *)((long)tmp.values.super_array<unsigned_short,_4UL>.elems + lVar3);
    *psVar2 = *psVar2 + 1;
    if (*psVar2 != 0) {
      return (uintwide_t<64U,_unsigned_short,_void,_true>)
             (array<unsigned_short,_4UL>)tmp.values.super_array<unsigned_short,_4UL>.elems;
    }
    bVar4 = lVar3 != 6;
    lVar3 = lVar3 + 2;
  } while (bVar4);
  return (uintwide_t<64U,_unsigned_short,_void,_true>)
         (array<unsigned_short,_4UL>)tmp.values.super_array<unsigned_short,_4UL>.elems;
}

Assistant:

constexpr auto operator-() const ->       uintwide_t  { uintwide_t tmp(*this); tmp.negate(); return tmp; }